

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.h
# Opt level: O0

void __thiscall Json::JsonParser::JsonParser(JsonParser *this,ifstream *ifs)

{
  ifstream *ifs_local;
  JsonParser *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->jsonValue);
  JsonReader::JsonReader(&this->__reader,ifs);
  this->__escape = false;
  this->__parser = false;
  return;
}

Assistant:

explicit JsonParser(std::ifstream &ifs) : __reader(ifs) {}